

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O1

Key * __thiscall QPixmapCache::Key::operator=(Key *this,Key *other)

{
  int *piVar1;
  KeyData *pKVar2;
  KeyData *pKVar3;
  Data *pDVar4;
  
  pKVar2 = this->d;
  pKVar3 = other->d;
  if (pKVar2 != pKVar3) {
    if (pKVar3 != (KeyData *)0x0) {
      pKVar3->ref = pKVar3->ref + 1;
    }
    if (pKVar2 != (KeyData *)0x0) {
      piVar1 = &pKVar2->ref;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pDVar4 = (pKVar2->stringKey).d.d;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pKVar2->stringKey).d.d)->super_QArrayData,2,0x10);
          }
        }
        operator_delete(pKVar2,0x28);
      }
    }
    this->d = other->d;
  }
  return this;
}

Assistant:

QPixmapCache::Key &QPixmapCache::Key::operator =(const Key &other)
{
    if (d != other.d) {
        if (other.d)
            ++(other.d->ref);
        if (d && --(d->ref) == 0)
            delete d;
        d = other.d;
    }
    return *this;
}